

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O1

int ReadSpectralEnvelope(char *filename,double **spectrogram)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  int number_of_dimensions;
  int fft_size;
  int number_of_frames;
  int local_34;
  int local_30;
  int local_2c;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File cannot be opened.");
  }
  else {
    iVar1 = anon_unknown.dwarf_ea93::CheckHeader((FILE *)__stream,"SPEC");
    if (iVar1 != 0) {
      anon_unknown.dwarf_ea93::LoadParameters((FILE *)__stream,&local_2c,&local_30,&local_34);
      if (0 < (long)local_2c) {
        lVar2 = 0;
        do {
          fread(spectrogram[lVar2],8,(long)local_34,__stream);
          lVar2 = lVar2 + 1;
        } while (local_2c != lVar2);
      }
      fclose(__stream);
      return 1;
    }
  }
  return 0;
}

Assistant:

int ReadSpectralEnvelope(const char *filename, double **spectrogram) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File cannot be opened.\n");
    return 0;
  }

  // Header
  if (CheckHeader(fp, "SPEC") == 0) return 0;

  // Parameters
  int number_of_frames, fft_size, number_of_dimensions;
  LoadParameters(fp, &number_of_frames, &fft_size, &number_of_dimensions);

  // Data
  for (int i = 0; i < number_of_frames; ++i)
    fread(spectrogram[i], 8, number_of_dimensions, fp);

  fclose(fp);
  return 1;
}